

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLDocument::Clear(XMLDocument *this)

{
  int iVar1;
  XMLNode **ppXVar2;
  XMLDocument *this_local;
  
  XMLNode::DeleteChildren(&this->super_XMLNode);
  while( true ) {
    iVar1 = DynArray<tinyxml2::XMLNode_*,_10>::Size(&this->_unlinked);
    if (iVar1 == 0) break;
    ppXVar2 = DynArray<tinyxml2::XMLNode_*,_10>::operator[](&this->_unlinked,0);
    DeleteNode(this,*ppXVar2);
  }
  ClearError(this);
  if (this->_charBuffer != (char *)0x0) {
    operator_delete__(this->_charBuffer);
  }
  this->_charBuffer = (char *)0x0;
  this->_parsingDepth = 0;
  return;
}

Assistant:

void XMLDocument::Clear()
{
    DeleteChildren();
    while (_unlinked.Size()) {
        DeleteNode(_unlinked[0]); // Will remove from _unlinked as part of delete.
    }

#ifdef TINYXML2_DEBUG
    const bool hadError = Error();
#endif
    ClearError();

    delete[] _charBuffer;
    _charBuffer = 0;
    _parsingDepth = 0;

#if 0
    _textPool.Trace( "text" );
    _elementPool.Trace( "element" );
    _commentPool.Trace( "comment" );
    _attributePool.Trace( "attribute" );
#endif

#ifdef TINYXML2_DEBUG
    if (!hadError) {
        TIXMLASSERT(_elementPool.CurrentAllocs() == _elementPool.Untracked());
        TIXMLASSERT(_attributePool.CurrentAllocs() == _attributePool.Untracked());
        TIXMLASSERT(_textPool.CurrentAllocs() == _textPool.Untracked());
        TIXMLASSERT(_commentPool.CurrentAllocs() == _commentPool.Untracked());
    }
#endif
}